

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::apply_and_log_current_params(raft_server *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  element_type *peVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  ptr<raft_params> params;
  undefined1 local_a0 [32];
  element_type *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  element_type *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  element_type *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  _Any_data local_50;
  _Manager_type local_40;
  element_type *local_38;
  
  context::get_params((context *)&params);
  if (((this->test_mode_flag_)._M_base._M_i & 1U) == 0) {
    if ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        election_timeout_lower_bound_ <=
        (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        heart_beat_interval_) {
      (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      election_timeout_lower_bound_ =
           (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           heart_beat_interval_ * 2;
      peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar4 != (element_type *)0x0) && (iVar5 = (*peVar4->_vptr_logger[7])(), 2 < iVar5)) {
        peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_a0,
                   "invalid election timeout lower bound detected, adjusted to %d",
                   (ulong)(uint)(params.
                                 super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->election_timeout_lower_bound_);
        (*peVar4->_vptr_logger[8])
                  (peVar4,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"apply_and_log_current_params",0x175,local_a0);
        if ((element_type *)local_a0._0_8_ != (element_type *)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_);
        }
      }
    }
    if ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        election_timeout_upper_bound_ <=
        (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        election_timeout_lower_bound_) {
      (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      election_timeout_upper_bound_ =
           (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           election_timeout_lower_bound_ * 2;
      peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar4 != (element_type *)0x0) && (iVar5 = (*peVar4->_vptr_logger[7])(), 2 < iVar5)) {
        peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_a0,
                   "invalid election timeout upper bound detected, adjusted to %d",
                   (ulong)(uint)(params.
                                 super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->election_timeout_upper_bound_);
        (*peVar4->_vptr_logger[8])
                  (peVar4,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"apply_and_log_current_params",0x17c,local_a0);
        if ((element_type *)local_a0._0_8_ != (element_type *)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_);
        }
      }
    }
  }
  peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar4 != (element_type *)0x0) && (iVar5 = (*peVar4->_vptr_logger[7])(), 3 < iVar5)) {
    local_38 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar1 = (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            election_timeout_upper_bound_;
    uVar2 = (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            election_timeout_lower_bound_;
    uVar3 = (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            heart_beat_interval_;
    uVar6 = get_leadership_expiry(this);
    local_40 = (_Manager_type)
               (ulong)(uint)(params.
                             super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->max_append_size_;
    local_50._8_8_ =
         ZEXT48((uint)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->snapshot_distance_);
    local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1645d0;
    if ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        enable_randomized_snapshot_creation_ != false) {
      local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1645cc;
    }
    local_50._M_unused._0_8_ =
         (undefined8)
         (ulong)(uint)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->rpc_failure_backoff_;
    pcVar9 = "OFF";
    pcVar11 = "OFF";
    if ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        auto_forwarding_ != false) {
      pcVar11 = "ON";
    }
    local_60 = (element_type *)
               (ulong)(uint)(params.
                             super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->log_sync_stop_gap_;
    pcVar7 = "ASYNC";
    pcVar8 = "ASYNC";
    if ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        return_method_ == blocking) {
      pcVar8 = "BLOCKING";
    }
    local_68._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (ulong)(uint)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->reserved_log_items_;
    pcVar10 = "INCLUDED";
    if ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        exclude_snp_receiver_from_quorum_ != false) {
      pcVar10 = "EXCLUDED";
    }
    local_70 = (element_type *)
               (ulong)(uint)(params.
                             super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->client_req_timeout_;
    if ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        use_bg_thread_for_snapshot_io_ == false) {
      pcVar7 = "BLOCKING";
    }
    if ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        parallel_log_appending_ != false) {
      pcVar9 = "ON";
    }
    local_78._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (ulong)(uint)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->custom_commit_quorum_size_;
    local_80 = (element_type *)
               (ulong)(uint)(params.
                             super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->custom_election_quorum_size_;
    msg_if_given_abi_cxx11_
              ((string *)local_a0,
               "parameters: timeout %d - %d, heartbeat %d, leadership expiry %d, max batch %d, backoff %d, snapshot distance %d, enable randomized snapshot creation %s, log sync stop gap %d, reserved logs %d, client timeout %d, auto forwarding %s, API call type %s, custom commit quorum size %d, custom election quorum size %d, snapshot receiver %s, leadership transfer wait time %d, grace period of lagging state machine %d, snapshot IO: %s, parallel log appending: %s"
               ,(ulong)uVar2,(ulong)uVar1,(ulong)uVar3,(ulong)uVar6,local_40,
               local_50._M_unused._M_object,local_50._8_8_,local_58._M_pi,local_60,local_68._M_pi,
               local_70,pcVar11,pcVar8,local_78._M_pi,local_80,pcVar10,
               (ulong)(uint)(params.
                             super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->leadership_transfer_min_wait_time_,
               (ulong)(uint)(params.
                             super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->grace_period_of_lagging_state_machine_,pcVar7,pcVar9);
    (*local_38->_vptr_logger[8])
              (local_38,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
               ,"apply_and_log_current_params",0x1a3,local_a0);
    if ((element_type *)local_a0._0_8_ != (element_type *)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_);
    }
  }
  timer_helper::set_duration_us
            (&this->status_check_timer_,
             (long)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->heart_beat_interval_ * 1000);
  timer_helper::reset(&this->status_check_timer_);
  timer_helper::set_duration_us
            (&this->leadership_transfer_timer_,
             (long)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->leadership_transfer_min_wait_time_ * 1000);
  if (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void raft_server::apply_and_log_current_params() {
    ptr<raft_params> params = ctx_->get_params();

    if (!test_mode_flag_) {
        if (params->heart_beat_interval_ >= params->election_timeout_lower_bound_) {
            params->election_timeout_lower_bound_ = params->heart_beat_interval_ * 2;
            p_wn("invalid election timeout lower bound detected, adjusted to %d",
                 params->election_timeout_lower_bound_);
        }
        if (params->election_timeout_lower_bound_
            >= params->election_timeout_upper_bound_) {
            params->election_timeout_upper_bound_ =
                params->election_timeout_lower_bound_ * 2;
            p_wn("invalid election timeout upper bound detected, adjusted to %d",
                 params->election_timeout_upper_bound_);
        }
    }

    p_in( "parameters: "
          "timeout %d - %d, heartbeat %d, "
          "leadership expiry %d, "
          "max batch %d, backoff %d, snapshot distance %d, "
          "enable randomized snapshot creation %s, "
          "log sync stop gap %d, "
          "reserved logs %d, client timeout %d, "
          "auto forwarding %s, API call type %s, "
          "custom commit quorum size %d, "
          "custom election quorum size %d, "
          "snapshot receiver %s, "
          "leadership transfer wait time %d, "
          "grace period of lagging state machine %d, "
          "snapshot IO: %s, "
          "parallel log appending: %s",
          params->election_timeout_lower_bound_,
          params->election_timeout_upper_bound_,
          params->heart_beat_interval_,
          get_leadership_expiry(),
          params->max_append_size_,
          params->rpc_failure_backoff_,
          params->snapshot_distance_,
          params->enable_randomized_snapshot_creation_ ? "YES" : "NO",
          params->log_sync_stop_gap_,
          params->reserved_log_items_,
          params->client_req_timeout_,
          ( params->auto_forwarding_ ? "ON" : "OFF" ),
          ( params->return_method_ == raft_params::blocking
            ? "BLOCKING" : "ASYNC" ),
          params->custom_commit_quorum_size_,
          params->custom_election_quorum_size_,
          params->exclude_snp_receiver_from_quorum_ ? "EXCLUDED" : "INCLUDED",
          params->leadership_transfer_min_wait_time_,
          params->grace_period_of_lagging_state_machine_,
          params->use_bg_thread_for_snapshot_io_ ? "ASYNC" : "BLOCKING",
          params->parallel_log_appending_ ? "ON" : "OFF" );

    status_check_timer_.set_duration_ms(params->heart_beat_interval_);
    status_check_timer_.reset();

    leadership_transfer_timer_.set_duration_ms
        (params->leadership_transfer_min_wait_time_);
}